

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O2

void __thiscall
vkt::sparse::anon_unknown_0::SparseBufferTestInstance::draw
          (SparseBufferTestInstance *this,VkPrimitiveTopology topology,
          VkDescriptorSetLayout descriptorSetLayout,SpecializationMap *specMap)

{
  IVec2 *this_00;
  Move<vk::Handle<(vk::HandleType)9>_> *this_01;
  Move<vk::Handle<(vk::HandleType)13>_> *this_02;
  Move<vk::Handle<(vk::HandleType)14>_> *this_03;
  Move<vk::Handle<(vk::HandleType)24>_> *this_04;
  Move<vk::VkCommandBuffer_s_*> *this_05;
  deUint32 dVar1;
  VkFormat VVar2;
  DeviceDriver *pDVar3;
  VkDevice pVVar4;
  Allocator *pAVar5;
  deUint64 dVar6;
  undefined8 uVar7;
  VkQueue queue;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkImageSubresourceRange subresourceRange;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Move<vk::Handle<(vk::HandleType)17>_> *this_06;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar11;
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar12;
  Move<vk::Handle<(vk::HandleType)16>_> *pMVar13;
  Move<vk::Handle<(vk::HandleType)23>_> *this_07;
  VkResult result;
  Renderer *pRVar14;
  ProgramBinary *pPVar15;
  mapped_type *ppVVar16;
  VkImageSubresourceRange *pVVar17;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 uVar18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  Move<vk::Handle<(vk::HandleType)17>_> *local_4a0;
  Move<vk::Handle<(vk::HandleType)14>_> *local_498;
  Vec4 *local_490;
  undefined1 local_488 [16];
  VkDevice local_478;
  VkCommandPool VStack_470;
  undefined8 local_468;
  VkImageCreateInfo *pVStack_460;
  undefined8 local_458;
  VkPipelineShaderStageCreateInfo *local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined4 local_438;
  undefined8 local_434;
  undefined8 uStack_42c;
  undefined4 local_424;
  Allocator *local_420;
  Move<vk::Handle<(vk::HandleType)18>_> *local_418;
  Move<vk::Handle<(vk::HandleType)16>_> *local_410;
  Move<vk::Handle<(vk::HandleType)23>_> *local_408;
  deUint32 local_3fc;
  VkImageCreateInfo imageParams;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_318;
  VkPipelineColorBlendAttachmentState *local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  VkPipelineShaderStageCreateInfo pShaderStages [2];
  RefBase<vk::Handle<(vk::HandleType)18>_> local_278;
  undefined8 local_258;
  undefined8 uStack_250;
  deUint32 local_248;
  UniquePtr<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  renderer;
  VkAttachmentReference colorAttachmentRef;
  Vector<float,_4> local_1f8;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  string local_1a0;
  string local_180;
  VkExtent2D local_160;
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  local_158;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkVertexInputAttributeDescription vertexInputAttributeDescription;
  VkRect2D scissor;
  VkViewport res;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  
  local_4a0 = (Move<vk::Handle<(vk::HandleType)17>_> *)CONCAT44(local_4a0._4_4_,topology);
  local_498 = (Move<vk::Handle<(vk::HandleType)14>_> *)descriptorSetLayout.m_internal;
  pRVar14 = (Renderer *)operator_new(0x198);
  pDVar3 = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
           super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pVVar4 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>
           .m_data.object;
  pAVar5 = (this->super_SparseResourcesBaseInstance).m_allocator.
           super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr;
  dVar1 = (this->m_universalQueue).queueFamilyIndex;
  local_490 = (Vec4 *)((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context)->
                      m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"vert",&local_4a1);
  local_420 = pAVar5;
  local_3fc = dVar1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"frag",&local_4a2);
  dVar6 = (this->m_colorBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
          m_internal;
  VVar2 = this->m_colorFormat;
  local_1f8.m_data[0] = 1.0;
  local_1f8.m_data[1] = 0.0;
  local_1f8.m_data[2] = 0.0;
  local_1f8.m_data[3] = 1.0;
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::_Rb_tree(&local_158,&specMap->_M_t);
  (pRVar14->m_colorBuffer).m_internal = dVar6;
  this_00 = &pRVar14->m_renderSize;
  tcu::Vector<int,_2>::Vector(this_00,&this->m_renderSize);
  pRVar14->m_colorFormat = VVar2;
  (pRVar14->m_colorSubresourceRange).aspectMask = 1;
  (pRVar14->m_colorSubresourceRange).baseMipLevel = 0;
  (pRVar14->m_colorSubresourceRange).levelCount = 1;
  (pRVar14->m_colorSubresourceRange).baseArrayLayer = 0;
  (pRVar14->m_colorSubresourceRange).layerCount = 1;
  tcu::Vector<float,_4>::Vector(&pRVar14->m_clearColor,&local_1f8);
  pRVar14->m_topology = (VkPrimitiveTopology)local_4a0;
  (pRVar14->m_descriptorSetLayout).m_internal = (deUint64)local_498;
  this_01 = &pRVar14->m_colorImage;
  this_02 = &pRVar14->m_colorAttachment;
  local_498 = &pRVar14->m_vertexModule;
  this_03 = &pRVar14->m_fragmentModule;
  local_4a0 = &pRVar14->m_renderPass;
  local_408 = &pRVar14->m_framebuffer;
  local_410 = &pRVar14->m_pipelineLayout;
  local_418 = &pRVar14->m_pipeline;
  this_04 = &pRVar14->m_cmdPool;
  this_05 = &pRVar14->m_cmdBuffer;
  (pRVar14->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
  ;
  (pRVar14->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (pRVar14->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (pRVar14->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (pRVar14->m_colorImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  memset(this_02,0,0x120);
  imageParams.format = pRVar14->m_colorFormat;
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  uVar7 = *(undefined8 *)(pRVar14->m_renderSize).m_data;
  imageParams.extent.width = (deUint32)uVar7;
  imageParams.extent.height = (deUint32)((ulong)uVar7 >> 0x20);
  imageParams.extent.depth = 1;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 1;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0x11;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams._80_8_ = (ulong)(uint)imageParams._84_4_ << 0x20;
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)pShaderStages,&pDVar3->super_DeviceInterface,
            pVVar4,&imageParams);
  local_478 = (VkDevice)pShaderStages[0]._16_8_;
  VStack_470.m_internal = pShaderStages[0].module.m_internal;
  local_488._0_8_ = pShaderStages[0]._0_8_;
  local_488._8_8_ = pShaderStages[0].pNext;
  pShaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pShaderStages[0]._4_4_ = 0;
  pShaderStages[0].pNext = (void *)0x0;
  pShaderStages[0].flags = 0;
  pShaderStages[0].stage = 0;
  pShaderStages[0].module.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (pRVar14->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       local_478;
  (pRVar14->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_470.m_internal;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
       local_488._0_8_;
  (pRVar14->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)local_488._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)pShaderStages);
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,
            &pDVar3->super_DeviceInterface,pVVar4,local_420,
            (VkImage)(this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                     m_internal,(MemoryRequirement)0x0);
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  data.ptr._4_4_ = in_stack_fffffffffffffb1c;
  data.ptr._0_4_ = in_stack_fffffffffffffb18;
  data._8_4_ = in_stack_fffffffffffffb20;
  data._12_4_ = in_stack_fffffffffffffb24;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&(pRVar14->m_colorImageAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
  pVVar17 = &pRVar14->m_colorSubresourceRange;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams);
  local_248 = (pRVar14->m_colorSubresourceRange).layerCount;
  local_258._0_4_ = pVVar17->aspectMask;
  local_258._4_4_ = pVVar17->baseMipLevel;
  uStack_250._0_4_ = (pRVar14->m_colorSubresourceRange).levelCount;
  uStack_250._4_4_ = (pRVar14->m_colorSubresourceRange).baseArrayLayer;
  uVar8 = pVVar17->aspectMask;
  uVar9 = pVVar17->baseMipLevel;
  uVar10 = pVVar17->levelCount;
  subresourceRange.levelCount = uVar10;
  subresourceRange.baseMipLevel = uVar9;
  subresourceRange.aspectMask = uVar8;
  subresourceRange.baseArrayLayer = uStack_250._4_4_;
  subresourceRange.layerCount = local_248;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_488,&pDVar3->super_DeviceInterface,
                pVVar4,(VkImage)(pRVar14->m_colorImage).
                                super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                m_internal,VK_IMAGE_VIEW_TYPE_2D,pRVar14->m_colorFormat,
                subresourceRange);
  imageParams._16_8_ = local_478;
  imageParams.format = (VkFormat)VStack_470.m_internal;
  imageParams.extent.width = (deUint32)(VStack_470.m_internal >> 0x20);
  imageParams._0_8_ = local_488._0_8_;
  imageParams.pNext = (void *)local_488._8_8_;
  local_488._0_8_ = 0;
  local_488._8_8_ = (DeviceInterface *)0x0;
  local_478 = (VkDevice)0x0;
  VStack_470.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_02->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (pRVar14->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)imageParams._16_8_;
  (pRVar14->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pRVar14->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_488);
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                      ((ProgramCollection<vk::ProgramBinary> *)local_490,&local_180);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_488,&pDVar3->super_DeviceInterface,
             pVVar4,pPVar15,0);
  pMVar11 = local_498;
  imageParams._16_8_ = local_478;
  imageParams.format = (VkFormat)VStack_470.m_internal;
  imageParams.extent.width = (deUint32)(VStack_470.m_internal >> 0x20);
  imageParams._0_8_ = local_488._0_8_;
  imageParams.pNext = (void *)local_488._8_8_;
  local_488._0_8_ = 0;
  local_488._8_8_ = (DeviceInterface *)0x0;
  local_478 = (VkDevice)0x0;
  VStack_470.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
            (&local_498->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pMVar11->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_488);
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get
                      ((ProgramCollection<vk::ProgramBinary> *)local_490,&local_1a0);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_488,&pDVar3->super_DeviceInterface,
             pVVar4,pPVar15,0);
  imageParams._16_8_ = local_478;
  imageParams.format = (VkFormat)VStack_470.m_internal;
  imageParams.extent.width = (deUint32)(VStack_470.m_internal >> 0x20);
  imageParams._0_8_ = local_488._0_8_;
  imageParams.pNext = (void *)local_488._8_8_;
  local_488._0_8_ = 0;
  local_488._8_8_ = (DeviceInterface *)0x0;
  local_478 = (VkDevice)0x0;
  VStack_470.m_internal = 0;
  local_490 = &pRVar14->m_clearColor;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
            (&this_03->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  (pRVar14->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device
       = (VkDevice)imageParams._16_8_;
  (pRVar14->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (this_03->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pRVar14->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_488);
  pShaderStages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  pShaderStages[0].pNext = (void *)0x0;
  pShaderStages[0].flags = 0;
  pShaderStages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  pShaderStages[0].module.m_internal =
       (local_498->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  pShaderStages[0].pName = "main";
  imageParams.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  ppVVar16 = std::
             map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
             ::operator[]((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
                           *)&local_158,&imageParams.sType);
  pShaderStages[0].pSpecializationInfo = *ppVVar16;
  pShaderStages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  pShaderStages[1].pNext = (void *)0x0;
  pShaderStages[1].flags = 0;
  pShaderStages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  pShaderStages[1].module.m_internal =
       (this_03->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  pShaderStages[1].pName = "main";
  local_488._0_4_ = VK_SHADER_STAGE_FRAGMENT_BIT;
  ppVVar16 = std::
             map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
             ::operator[]((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
                           *)&local_158,(key_type *)local_488);
  this_07 = local_408;
  this_06 = local_4a0;
  pShaderStages[1].pSpecializationInfo = *ppVVar16;
  VStack_470.m_internal = (deUint64)&pipelineRasterizationStateInfo;
  pipelineRasterizationStateInfo._0_8_ = (ulong)pRVar14->m_colorFormat << 0x20;
  pipelineRasterizationStateInfo.pNext = (void *)0x100000001;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 2;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 1;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  pipelineRasterizationStateInfo.cullMode = 2;
  imageParams.extent._4_8_ = &colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.extent.width = 0;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.samples = 0;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  local_488._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_488._8_8_ = (DeviceInterface *)0x0;
  imageParams.format = VK_FORMAT_R4G4_UNORM_PACK8;
  local_478 = (VkDevice)&DAT_100000000;
  local_468._0_4_ = 1;
  local_458 = (ulong)local_458._4_4_ << 0x20;
  local_450 = (VkPipelineShaderStageCreateInfo *)0x0;
  pVStack_460 = &imageParams;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&local_318,&pDVar3->super_DeviceInterface,
             pVVar4,(VkRenderPassCreateInfo *)local_488,(VkAllocationCallbacks *)0x0);
  imageParams._16_8_ = local_318.m_data.deleter.m_device;
  imageParams.format = (VkFormat)local_318.m_data.deleter.m_allocator;
  imageParams.extent.width = (deUint32)((ulong)local_318.m_data.deleter.m_allocator >> 0x20);
  imageParams._0_8_ = local_318.m_data.object.m_internal;
  imageParams.pNext = local_318.m_data.deleter.m_deviceIface;
  local_318.m_data.object.m_internal = 0;
  local_318.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_318.m_data.deleter.m_device = (VkDevice)0x0;
  local_318.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            (&this_06->super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  (this_06->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (this_06->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (this_06->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (this_06->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_318);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)local_488,&pDVar3->super_DeviceInterface,
                  pVVar4,(VkRenderPass)
                         (pRVar14->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.
                         m_data.object.m_internal,1,(VkImageView *)this_02,
                  (pRVar14->m_renderSize).m_data[0],(pRVar14->m_renderSize).m_data[1],1);
  imageParams._16_8_ = local_478;
  imageParams.format = (VkFormat)VStack_470.m_internal;
  imageParams.extent.width = (deUint32)(VStack_470.m_internal >> 0x20);
  imageParams._0_8_ = local_488._0_8_;
  imageParams.pNext = (void *)local_488._8_8_;
  local_488._0_8_ = 0;
  local_488._8_8_ = (DeviceInterface *)0x0;
  local_478 = (VkDevice)0x0;
  VStack_470.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&this_07->super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  (this_07->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (this_07->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (this_07->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (this_07->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_488);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_488,
                     &pDVar3->super_DeviceInterface,pVVar4,
                     (VkDescriptorSetLayout)(pRVar14->m_descriptorSetLayout).m_internal);
  pMVar13 = local_410;
  imageParams._16_8_ = local_478;
  imageParams.format = (VkFormat)VStack_470.m_internal;
  imageParams.extent.width = (deUint32)(VStack_470.m_internal >> 0x20);
  imageParams._0_8_ = local_488._0_8_;
  imageParams.pNext = (void *)local_488._8_8_;
  local_488._0_8_ = 0;
  local_488._8_8_ = (DeviceInterface *)0x0;
  local_478 = (VkDevice)0x0;
  VStack_470.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            (&local_410->super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (pMVar13->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (pMVar13->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (pMVar13->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pMVar13->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_488);
  local_420 = (Allocator *)
              (pRVar14->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
              m_internal;
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&local_160,this_00);
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x10;
  colorAttachmentRef.attachment = 0x13;
  pipelineViewportStateInfo.scissorCount = 1;
  imageParams._40_8_ = &pipelineInputAssemblyStateInfo;
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineViewportStateInfo.pViewports = &res;
  res.x = 0.0;
  res.y = 0.0;
  res.width = (float)(int)local_160.width;
  res.height = (float)(int)local_160.height;
  pipelineViewportStateInfo.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  pipelineInputAssemblyStateInfo._16_8_ = (ulong)pRVar14->m_topology << 0x20;
  scissor.extent = local_160;
  imageParams._56_8_ = &pipelineViewportStateInfo;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.pNext = (void *)0x0;
  res.minDepth = 0.0;
  res.maxDepth = 1.0;
  pipelineViewportStateInfo.flags = 0;
  pipelineViewportStateInfo.viewportCount = 1;
  imageParams.pQueueFamilyIndices = &pipelineMultisampleStateInfo.sType;
  pipelineMultisampleStateInfo.pNext = (void *)0x0;
  pipelineMultisampleStateInfo.sampleShadingEnable = 0;
  pipelineMultisampleStateInfo.minSampleShading = 0.0;
  pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)0x0;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0;
  pipelineMultisampleStateInfo.alphaToOneEnable = 0;
  pipelineMultisampleStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  pipelineMultisampleStateInfo._4_4_ = 0;
  pipelineMultisampleStateInfo.flags = 0;
  pipelineMultisampleStateInfo.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_488._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_488._8_8_ = (DeviceInterface *)0x0;
  local_478 = (VkDevice)0x0;
  VStack_470.m_internal = (deUint64)&DAT_100000000;
  local_458._0_4_ = 0;
  local_458._4_4_ = 7;
  imageParams.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_3D;
  imageParams._24_8_ = pShaderStages;
  imageParams.extent._4_8_ = &colorAttachmentRef;
  pipelineRasterizationStateInfo.pNext = (void *)0x0;
  pipelineRasterizationStateInfo.depthBiasClamp = 0.0;
  pipelineRasterizationStateInfo.depthBiasSlopeFactor = 0.0;
  pipelineRasterizationStateInfo.cullMode = 0;
  pipelineRasterizationStateInfo.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  pipelineRasterizationStateInfo.depthBiasEnable = 0;
  pipelineRasterizationStateInfo.depthBiasConstantFactor = 0.0;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 0;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  pipelineRasterizationStateInfo._4_4_ = 0;
  pipelineRasterizationStateInfo.lineWidth = 1.0;
  pipelineRasterizationStateInfo._60_4_ = 0;
  local_468._0_4_ = 0;
  local_468._4_4_ = 0;
  pVStack_460 = (VkImageCreateInfo *)0x0;
  local_450 = (VkPipelineShaderStageCreateInfo *)0x0;
  uStack_448 = 0;
  local_440 = 0;
  local_438 = 7;
  imageParams.samples = 0;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_434 = 0;
  uStack_42c = 0;
  local_424 = 0x3f800000;
  imageParams._64_8_ = &pipelineRasterizationStateInfo;
  local_318.m_data.object.m_internal._0_4_ = 0x1a;
  local_318.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_318.m_data.deleter.m_device = (VkDevice)0x0;
  local_318.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x100000003;
  local_2f8 = &pipelineColorBlendAttachmentState;
  pipelineColorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.alphaBlendOp = VK_BLEND_OP_ADD;
  pipelineColorBlendAttachmentState.colorWriteMask = 0xf;
  pipelineColorBlendAttachmentState.blendEnable = 0;
  pipelineColorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_ADD;
  local_2f0 = 0;
  uStack_2e8 = 0;
  imageParams._80_8_ = (RefBase<vk::Handle<(vk::HandleType)16>_> *)local_488;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_278,&pDVar3->super_DeviceInterface,
             pVVar4,(VkPipelineCache)0x0,(VkGraphicsPipelineCreateInfo *)&imageParams,
             (VkAllocationCallbacks *)0x0);
  pMVar12 = local_418;
  imageParams._16_8_ = local_278.m_data.deleter.m_device;
  imageParams.format = (VkFormat)local_278.m_data.deleter.m_allocator;
  imageParams.extent.width = (deUint32)((ulong)local_278.m_data.deleter.m_allocator >> 0x20);
  imageParams._0_8_ = local_278.m_data.object.m_internal;
  imageParams.pNext = local_278.m_data.deleter.m_deviceIface;
  local_278.m_data.object.m_internal = 0;
  local_278.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_data.deleter.m_device = (VkDevice)0x0;
  local_278.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            (&local_418->super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (pMVar12->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (pMVar12->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (pMVar12->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pMVar12->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_278);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)local_488,&pDVar3->super_DeviceInterface,
                  pVVar4,local_3fc);
  imageParams._16_8_ = local_478;
  imageParams.format = (VkFormat)VStack_470.m_internal;
  imageParams.extent.width = (deUint32)(VStack_470.m_internal >> 0x20);
  imageParams._0_8_ = local_488._0_8_;
  imageParams.pNext = (void *)local_488._8_8_;
  local_488._0_8_ = 0;
  local_488._8_8_ = (DeviceInterface *)0x0;
  local_478 = (VkDevice)0x0;
  VStack_470.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&this_04->super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  (pRVar14->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (pRVar14->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (this_04->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pRVar14->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_488);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_488,&pDVar3->super_DeviceInterface,pVVar4,
             (VkCommandPool)
             (this_04->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  imageParams._16_8_ = local_478;
  imageParams.format = (VkFormat)VStack_470.m_internal;
  imageParams.extent.width = (deUint32)(VStack_470.m_internal >> 0x20);
  imageParams._0_8_ = local_488._0_8_;
  imageParams.pNext = (void *)local_488._8_8_;
  local_488._0_8_ = 0;
  local_488._8_8_ = (DeviceInterface *)0x0;
  local_478 = (VkDevice)0x0;
  VStack_470.m_internal = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            (&this_05->super_RefBase<vk::VkCommandBuffer_s_*>);
  (pRVar14->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (pRVar14->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       CONCAT44(imageParams.extent.width,imageParams.format);
  (this_05->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object =
       (VkCommandBuffer_s *)imageParams._0_8_;
  (pRVar14->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageParams.pNext;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_488);
  renderer.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  .m_data.ptr = pRVar14;
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~_Rb_tree(&local_158);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  pDVar3 = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
           super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pVVar4 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.super_RefBase<vk::VkDevice_s_*>
           .m_data.object;
  queue = (this->m_universalQueue).queueHandle;
  beginCommandBuffer(&pDVar3->super_DeviceInterface,
                     (pRVar14->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pShaderStages[0].sType = (VkStructureType)local_490->m_data[0];
  pShaderStages[0]._4_4_ = local_490->m_data[1];
  pShaderStages[0].pNext = *(void **)(local_490->m_data + 2);
  pVStack_460 = *(VkImageCreateInfo **)this_00->m_data;
  local_488._0_4_ = 0x2b;
  local_488._8_8_ = (DeviceInterface *)0x0;
  local_478 = (VkDevice)
              (local_4a0->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal;
  VStack_470.m_internal =
       (local_408->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal;
  local_468._0_4_ = 0;
  local_468._4_4_ = 0;
  local_458._0_4_ = 1;
  local_450 = pShaderStages;
  (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[0x74])
            (pDVar3,(this_05->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,local_488,0);
  (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[0x4c])
            (pDVar3,(this_05->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0,
             (local_418->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
  (*(this->super_Delegate)._vptr_Delegate[2])
            (&this->super_Delegate,
             (local_410->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal,
             (this_05->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[0x76])
            (pDVar3,(this_05->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x100;
  imageParams.imageType = 0x800;
  imageParams.format = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
  imageParams.extent.width = 6;
  imageParams.extent.height = 0xffffffff;
  imageParams.extent.depth = 0xffffffff;
  dVar6 = (this_01->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  imageParams.mipLevels = (deUint32)dVar6;
  imageParams.arrayLayers = (deUint32)(dVar6 >> 0x20);
  imageParams.samples = pVVar17->aspectMask;
  imageParams.tiling = (pRVar14->m_colorSubresourceRange).baseMipLevel;
  imageParams.usage = (pRVar14->m_colorSubresourceRange).levelCount;
  imageParams.sharingMode = (pRVar14->m_colorSubresourceRange).baseArrayLayer;
  imageParams.queueFamilyIndexCount = (pRVar14->m_colorSubresourceRange).layerCount;
  (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
            (pDVar3,(this_05->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x400,0x1000,0,0
             ,0,0,0,1,(VkGraphicsPipelineCreateInfo *)&imageParams);
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 1;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 1;
  imageParams.extent.height = 0;
  imageParams.extent.depth = 0;
  imageParams.mipLevels = 0;
  uVar7 = *(undefined8 *)(pRVar14->m_renderSize).m_data;
  imageParams.arrayLayers = (deUint32)uVar7;
  imageParams.samples = (VkSampleCountFlagBits)((ulong)uVar7 >> 0x20);
  imageParams.tiling = VK_IMAGE_TILING_LINEAR;
  uVar18 = SUB84((VkGraphicsPipelineCreateInfo *)&imageParams,0);
  (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[99])
            (pDVar3,(pRVar14->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (pRVar14->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,(pRVar14->m_colorBuffer).m_internal,1,uVar18);
  imageParams.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x1000;
  imageParams.imageType = 0x2000;
  imageParams.format = ~VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0xffffffff;
  dVar6 = (pRVar14->m_colorBuffer).m_internal;
  imageParams.extent.height = (deUint32)dVar6;
  imageParams.extent.depth = (deUint32)(dVar6 >> 0x20);
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.samples = 0xffffffff;
  imageParams.tiling = ~VK_IMAGE_TILING_OPTIMAL;
  (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
            (pDVar3,(pRVar14->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             0x1000,0x4000,0,0,0,1,uVar18,0,0);
  result = (*(pDVar3->super_DeviceInterface)._vptr_DeviceInterface[0x4a])
                     (pDVar3,(this_05->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(result,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferTests.cpp"
                    ,0x29c);
  submitCommandsAndWait
            (&pDVar3->super_DeviceInterface,pVVar4,queue,
             (this_05->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0,(VkSemaphore *)0x0,
             (VkPipelineStageFlags *)0x0,0,(VkSemaphore *)0x0);
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  ::~UniqueBase(&renderer.
                 super_UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
               );
  return;
}

Assistant:

void draw (const VkPrimitiveTopology	topology,
			   const VkDescriptorSetLayout	descriptorSetLayout	= DE_NULL,
			   Renderer::SpecializationMap	specMap				= Renderer::SpecializationMap())
	{
		const UniquePtr<Renderer> renderer(new Renderer(
			getDeviceInterface(), getDevice(), getAllocator(), m_universalQueue.queueFamilyIndex, descriptorSetLayout,
			m_context.getBinaryCollection(), "vert", "frag", *m_colorBuffer, m_renderSize, m_colorFormat, Vec4(1.0f, 0.0f, 0.0f, 1.0f), topology, specMap));

		renderer->draw(getDeviceInterface(), getDevice(), m_universalQueue.queueHandle, *this);
	}